

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_invoke_static_task(Executor *this,Worker *worker,Node *node)

{
  function<void_()> *in_RDI;
  Node *unaff_retaddr;
  Worker *in_stack_00000008;
  Executor *in_stack_00000010;
  
  _observer_prologue(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::
  get_if<tf::Node::Static,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
            ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              *)0x1153dd);
  std::function<void_()>::operator()(in_RDI);
  _observer_epilogue(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

inline void Executor::_invoke_static_task(Worker& worker, Node* node) {
  _observer_prologue(worker, node);
  TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
    std::get_if<Node::Static>(&node->_handle)->work();
  });
  _observer_epilogue(worker, node);
}